

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

error assemble_signed_20bit_immediate(context *ctx,token *token,opcode *op)

{
  bool bVar1;
  uint64_t *result;
  ulong uVar2;
  uint64_t uVar3;
  int64_t in_RCX;
  token local_80;
  ulong local_58;
  uint64_t negative;
  uint64_t raw;
  byte local_31;
  uint64_t local_30;
  int64_t value;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  error *tmpres___LINE__;
  
  local_30 = 0;
  local_31 = 0;
  value = in_RCX;
  op_local = op;
  token_local = token;
  ctx_local = ctx;
  result = (uint64_t *)max_bits(0x13);
  convert_integer((token *)ctx,(int64_t)op,-0x80000,result);
  bVar1 = error::operator_cast_to_bool((error *)ctx);
  if (bVar1) {
    local_31 = 1;
  }
  raw._0_4_ = (uint)bVar1;
  if ((local_31 & 1) == 0) {
    error::~error((error *)ctx);
  }
  if ((uint)raw == 0) {
    negative = 0;
    local_58 = 0;
    bVar1 = -1 < (long)local_30;
    if (bVar1) {
      negative = local_30;
    }
    else {
      uVar2 = local_30 - 0x80000;
      uVar3 = max_bits(0x13);
      negative = uVar2 & uVar3;
    }
    local_58 = (ulong)!bVar1;
    opcode::add_bits((opcode *)value,negative << 0x14);
    opcode::add_bits((opcode *)value,local_58 << 0x38);
    context::tokenize(&local_80,(context *)token_local);
    memcpy(op_local,&local_80,0x24);
    memset(ctx,0,8);
    error::error((error *)ctx);
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

error assemble_signed_20bit_immediate(context& ctx, token& token, opcode& op)
{
    int64_t value = 0;
    CHECK(convert_integer(token, -(1 << 19), max_bits(19), reinterpret_cast<uint64_t*>(&value)));

    uint64_t raw = 0;
    uint64_t negative = 0;
    if (value < 0) {
        raw = (value - (1 << 19)) & max_bits(19);
        negative = 1;
    } else {
        raw = static_cast<uint64_t>(value);
        negative = 0;
    }

    op.add_bits(raw << 20);
    op.add_bits(negative << 56);

    token = ctx.tokenize();
    return {};
}